

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall
xmrig::HttpServer::onConnection(HttpServer *this,uv_stream_t *stream,uint16_t param_3)

{
  HttpContext *this_00;
  uv_stream_t *puVar1;
  _func_void_uv_handle_t_ptr_size_t_uv_buf_t_ptr *p_Var2;
  _func_void_uv_stream_t_ptr_ssize_t_uv_buf_t_ptr *p_Var3;
  undefined8 in_RSI;
  IHttpListener *unaff_retaddr;
  int in_stack_0000000c;
  HttpContext *in_stack_00000010;
  HttpContext *ctx;
  __1 local_2e;
  __0 local_2d [13];
  HttpContext *local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  this_00 = (HttpContext *)operator_new(0xe8);
  HttpContext::HttpContext(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  local_20 = this_00;
  puVar1 = HttpContext::stream(this_00);
  uv_accept(local_10,puVar1);
  puVar1 = HttpContext::stream(local_20);
  p_Var2 = onConnection(uv_stream_s*,unsigned_short)::$_0::operator_cast_to_function_pointer
                     (local_2d);
  p_Var3 = onConnection(uv_stream_s*,unsigned_short)::$_1::operator_cast_to_function_pointer
                     (&local_2e);
  uv_read_start(puVar1,p_Var2,p_Var3);
  return;
}

Assistant:

void xmrig::HttpServer::onConnection(uv_stream_t *stream, uint16_t)
{
    HttpContext *ctx = new HttpContext(HTTP_REQUEST, m_listener);
    uv_accept(stream, ctx->stream());

    uv_read_start(ctx->stream(),
        [](uv_handle_t *, size_t suggested_size, uv_buf_t *buf)
        {
            buf->base = new char[suggested_size];

#           ifdef _WIN32
            buf->len = static_cast<unsigned int>(suggested_size);
#           else
            buf->len = suggested_size;
#           endif
        },
        [](uv_stream_t *tcp, ssize_t nread, const uv_buf_t *buf)
        {
            HttpContext *ctx = static_cast<HttpContext*>(tcp->data);

            if (nread >= 0) {
                const size_t size   = static_cast<size_t>(nread);
                const size_t parsed = ctx->parse(buf->base, size);

                if (parsed < size) {
                    ctx->close();
                }
            } else {
                ctx->close();
            }

            delete [] buf->base;
        });
}